

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O3

tuple<Chainstate_*,_Chainstate_*> __thiscall
validation_chainstatemanager_tests::SnapshotTestSetup::SetupSnapshot(SnapshotTestSetup *this)

{
  path *__p;
  undefined1 auVar1 [16];
  MessageStartChars MVar2;
  __uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_> _Var3;
  pointer psVar4;
  element_type *peVar5;
  pointer ppCVar6;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_00;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_01;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_02;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_03;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_04;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_05;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_06;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_07;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_08;
  path chaindir;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  path *data_dir;
  __index_type _Var9;
  undefined8 uVar10;
  bool bVar11;
  char cVar12;
  undefined1 uVar13;
  uint uVar14;
  int iVar15;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar16;
  Chainstate *pCVar17;
  CCoinsViewCache *pCVar18;
  Chainstate *pCVar19;
  FILE *pFVar20;
  uchar *puVar21;
  CChainParams *pCVar22;
  Chainstate *pCVar23;
  unit_test_log_t *puVar24;
  Chainstate *pCVar25;
  long lVar26;
  _Head_base<0UL,_Chainstate_*,_false> extraout_RDX;
  ChainstateManager *pCVar27;
  long *plVar28;
  TestChain100Setup *in_RSI;
  pointer pAVar29;
  COutPoint *pCVar30;
  _Alloc_hider _Var31;
  mutex_type *pmVar32;
  char *pcVar33;
  iterator pvVar34;
  iterator in_R9;
  iterator pvVar35;
  CBlockIndex *pCVar36;
  bool *pbVar37;
  size_t sVar38;
  pointer psVar39;
  CTransactionRef *txn;
  long in_FS_OFFSET;
  byte bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  initializer_list<unsigned_short> __l;
  const_string file_09;
  const_string file_10;
  initializer_list<unsigned_short> __l_00;
  const_string file_11;
  initializer_list<unsigned_short> __l_01;
  const_string file_12;
  initializer_list<unsigned_short> __l_02;
  const_string file_13;
  initializer_list<unsigned_short> __l_03;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  tuple<Chainstate_*,_Chainstate_*> tVar47;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  check_type cVar51;
  undefined8 in_stack_fffffffffffff7e8;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar48;
  ChainstateManager *pCVar49;
  TestChain100Setup *this_00;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> node;
  pointer pcVar50;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  long local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  size_t coins_missing_from_background;
  int chains_tested;
  undefined4 uStack_70c;
  undefined1 *local_708 [2];
  char *local_6f8 [2];
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  int height;
  undefined4 uStack_674;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  size_t new_coins;
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_458;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  size_t initial_total_coins;
  size_t initial_size;
  char *local_318 [2];
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 local_288 [16];
  long local_278;
  size_t total_coins;
  bool bStack_260;
  undefined7 uStack_25f;
  long local_258;
  path local_248;
  undefined1 local_220 [16];
  undefined1 auStack_210 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_208 [2];
  __index_type local_1e0;
  COutPoint op;
  undefined1 local_1b0 [28];
  undefined1 local_194 [16];
  uint64_t local_180;
  AutoFile auto_infile;
  UniValue result;
  uint256 loaded_snapshot_blockhash;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  path snapshot_path;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  long local_38;
  
  auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  auStack_210 = (undefined1  [8])local_220._8_8_;
  bVar40 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar48 = &(in_RSI->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
             chainman;
  pcVar33 = "m_node.chainman";
  puVar16 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (puVar48,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
                       ,0xb7,"SetupSnapshot","m_node.chainman");
  pCVar49 = (puVar16->_M_t).
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xb9;
  file.m_begin = (iterator)&local_298;
  msg.m_end = in_R9;
  msg.m_begin = pcVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a8,msg);
  _cVar51 = 0x76ec5d;
  bVar11 = ChainstateManager::IsSnapshotActive(pCVar49);
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  local_220._0_8_ = "!chainman.IsSnapshotActive()";
  local_220._8_8_ = (long)"!chainman.IsSnapshotActive()" + 0x1c;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2b0 = "";
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = local_220;
  result.typ._0_1_ = !bVar11;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,1,0,WARN,_cVar51,(size_t)&local_2b8,
             0xb9);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = &cs_main;
  auVar1[0xf] = 0;
  auVar1[0] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9];
  auVar1[1] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10];
  auVar1[2] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb];
  auVar1[3] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc];
  auVar1[4] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd];
  auVar1[5] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe];
  auVar1[6] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf];
  auVar1[7] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10];
  auVar1[8] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11];
  auVar1[9] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12];
  auVar1[10] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13];
  auVar1[0xb] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14];
  auVar1[0xc] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15];
  auVar1[0xd] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16];
  auVar1[0xe] = loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17];
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_16_ = auVar1 << 8;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&loaded_snapshot_blockhash);
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar51 = 0x76ed47;
  file_00.m_end = (iterator)0xbd;
  file_00.m_begin = (iterator)&local_2c8;
  msg_00.m_end = pvVar35;
  msg_00.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2d8,
             msg_00);
  result.typ._0_1_ = 1;
  if ((((_Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>)
       (pCVar49->m_snapshot_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t).
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_> !=
       (_Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>)0x0) &&
     (_Var3._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
           *(tuple<Chainstate_*,_std::default_delete<Chainstate>_> *)
            &(pCVar49->m_ibd_chainstate)._M_t,
     (_Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>)
     _Var3._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
     super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0)) {
    result.typ._0_1_ =
         *(byte *)((long)_Var3._M_t.
                         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x38) ^ 1;
  }
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  local_220._0_8_ = "!chainman.IsSnapshotValidated()";
  local_220._8_8_ = (element_type *)0xf56340;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2e0 = "";
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = local_220;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,1,0,WARN,_cVar51,(size_t)&local_2e8,
             0xbd);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xbe;
  file_01.m_begin = (iterator)&local_2f8;
  msg_01.m_end = pvVar35;
  msg_01.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_308,
             msg_01);
  data_dir = &(pCVar49->m_options).datadir;
  _cVar51 = 0x76ee3e;
  ::node::FindSnapshotChainstateDir((optional<fs::path> *)&op,data_dir);
  local_220._0_8_ = CONCAT71(local_220._1_7_,local_1b0[0]) ^ 1;
  local_220._8_8_ = (element_type *)0x0;
  auStack_210 = (undefined1  [8])0x0;
  result.val.field_2._M_allocated_capacity = (size_type)&auto_infile;
  auto_infile.m_file = (FILE *)anon_var_dwarf_1e2f08f;
  auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf5637d;
  result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
  result._0_8_ = &PTR__lazy_ostream_01389048;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_318[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_318[1] = "";
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_220,(lazy_ostream *)&result,1,0,WARN,_cVar51,
             (size_t)local_318,0xbe);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_210);
  if (local_1b0[0] == '\x01') {
    local_1b0[0] = '\0';
    std::filesystem::__cxx11::path::~path((path *)&op);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&loaded_snapshot_blockhash);
  initial_total_coins = 100;
  criticalblock32.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  auVar8[0xf] = 0;
  auVar8._0_15_ = stack0xffffffffffffffa9;
  stack0xffffffffffffffa8 = (shared_ptr<boost::basic_wrap_stringstream<char>_>)(auVar8 << 8);
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock32.super_unique_lock);
  pCVar17 = ChainstateManager::ActiveChainstate(pCVar49);
  pCVar18 = Chainstate::CoinsTip(pCVar17);
  uVar14 = CCoinsViewCache::GetCacheSize(pCVar18);
  initial_size = (size_t)uVar14;
  total_coins = 0;
  sVar38 = total_coins;
  total_coins = 0;
  psVar39 = (in_RSI->m_coinbase_txns).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (in_RSI->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar39 != psVar4) {
    do {
      peVar5 = (psVar39->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      op.n = 0;
      local_338 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_330 = "";
      local_348 = &boost::unit_test::basic_cstring<char_const>::null;
      local_340 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0xcd;
      file_02.m_begin = (iterator)&local_338;
      msg_02.m_end = pvVar35;
      msg_02.m_begin = pvVar34;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_348,
                 msg_02);
      _cVar51 = 0x76f028;
      iVar15 = (*(pCVar18->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                         (pCVar18,&op);
      local_220[0] = (char)iVar15;
      local_220._8_8_ = (element_type *)0x0;
      auStack_210 = (undefined1  [8])0x0;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1e2f09b
      ;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
      result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
      result._0_8_ = &PTR__lazy_ostream_01389048;
      result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
      result.val.field_2._M_allocated_capacity = (size_type)&loaded_snapshot_blockhash;
      local_358 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_350 = "";
      pvVar34 = (iterator)0x1;
      pvVar35 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_220,(lazy_ostream *)&result,1,0,WARN,_cVar51,
                 (size_t)&local_358,0xcd);
      boost::detail::shared_count::~shared_count((shared_count *)auStack_210);
      total_coins = total_coins + 1;
      psVar39 = psVar39 + 1;
      sVar38 = total_coins;
    } while (psVar39 != psVar4);
  }
  total_coins = sVar38;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xd1;
  file_03.m_begin = (iterator)&local_368;
  msg_03.m_end = pvVar35;
  msg_03.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_378,
             msg_03);
  local_220._8_8_ = local_220._9_8_ << 8;
  local_220._0_8_ = &PTR__lazy_ostream_01388f08;
  auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  snapshot_path.super_path._M_pathname._M_dataplus._M_p = (pointer)&total_coins;
  criticalblock36.super_unique_lock._M_device = (mutex_type *)&initial_total_coins;
  aaStack_208[0]._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  auto_infile.m_file = (FILE *)anon_var_dwarf_1e215e9;
  auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf54b3e;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01388f48;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
  result._0_8_ = &PTR__lazy_ostream_01388f48;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &snapshot_path;
  result.val.field_2._M_allocated_capacity = (size_type)&criticalblock36;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0] =
       total_coins == initial_total_coins;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&loaded_snapshot_blockhash,(lazy_ostream *)local_220,1,2,REQUIRE,
             0xf563a2,(size_t)&auto_infile,0xd1,&op,"initial_total_coins",&result);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xd2;
  file_04.m_begin = (iterator)&local_388;
  msg_04.m_end = pvVar35;
  msg_04.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_398,
             msg_04);
  local_220._8_8_ = local_220._9_8_ << 8;
  local_220._0_8_ = &PTR__lazy_ostream_01388f08;
  auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  snapshot_path.super_path._M_pathname._M_dataplus._M_p = (pointer)&initial_size;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0] =
       initial_size == initial_total_coins;
  aaStack_208[0]._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  auto_infile.m_file = (FILE *)anon_var_dwarf_1e215e9;
  auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf54b3e;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01388f48;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  criticalblock36.super_unique_lock._M_device = (mutex_type *)&initial_total_coins;
  result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
  result._0_8_ = &PTR__lazy_ostream_01388f48;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &snapshot_path;
  result.val.field_2._M_allocated_capacity = (size_type)&criticalblock36;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&loaded_snapshot_blockhash,(lazy_ostream *)local_220,1,2,REQUIRE,
             0xf563ae,(size_t)&auto_infile,0xd2,&op,"initial_total_coins",&result);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock32.super_unique_lock);
  pCVar27 = pCVar49;
  pCVar17 = ChainstateManager::ActiveChainstate(pCVar49);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xd8;
  file_05.m_begin = (iterator)&local_3a8;
  msg_05.m_end = pvVar35;
  msg_05.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3b8,
             msg_05);
  _cVar51 = 0x76f3ff;
  bVar11 = CreateAndActivateUTXOSnapshot<__25_const>(in_RSI);
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  local_220._0_8_ = "!CreateAndActivateUTXOSnapshot(this)";
  local_220._8_8_ = (long)"!CreateAndActivateUTXOSnapshot(this)" + 0x24;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3c0 = "";
  pvVar34 = (iterator)0x2;
  pvVar35 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)local_220;
  result.typ._0_1_ = !bVar11;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,2,0,WARN,_cVar51,(size_t)&local_3c8,
             0xd8);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xd9;
  file_06.m_begin = (iterator)&local_3d8;
  msg_06.m_end = pvVar35;
  msg_06.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3e8,
             msg_06);
  _cVar51 = 0x76f4cc;
  pCVar19 = ChainstateManager::ActiveChainstate(pCVar49);
  result._0_8_ = CONCAT71(result._1_7_,
                          (pCVar19->m_from_snapshot_blockhash).
                          super__Optional_base<uint256,_true,_true>._M_payload.
                          super__Optional_payload_base<uint256>._M_engaged) ^ 1;
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  local_220._0_8_ = "!chainman.ActiveChainstate().m_from_snapshot_blockhash";
  local_220._8_8_ = (element_type *)0xf56416;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3f0 = "";
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)local_220;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,1,0,WARN,_cVar51,(size_t)&local_3f8,
             0xd9);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xda;
  file_07.m_begin = (iterator)&local_408;
  msg_07.m_end = pvVar35;
  msg_07.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_418,
             msg_07);
  _cVar51 = 0x76f5ae;
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)&op,pCVar49);
  local_220._0_8_ = CONCAT71(local_220._1_7_,(undefined1)op.n) ^ 1;
  local_220._8_8_ = (element_type *)0x0;
  auStack_210 = (undefined1  [8])0x0;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1e2f0e3;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
  result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
  result._0_8_ = &PTR__lazy_ostream_01389048;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (size_type)&loaded_snapshot_blockhash;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_420 = "";
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_220,(lazy_ostream *)&result,1,0,WARN,_cVar51,
             (size_t)&local_428,0xda);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_210);
  this_00 = in_RSI;
  TestChain100Setup::mineBlocks(in_RSI,10);
  initial_size = initial_size + 10;
  initial_total_coins = initial_total_coins + 10;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xf1;
  file_08.m_begin = (iterator)&local_438;
  msg_08.m_end = pvVar35;
  msg_08.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_448,
             msg_08);
  __p = &(in_RSI->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_path_root;
  std::filesystem::__cxx11::path::path((path *)&criticalblock32,&__p->super_path);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &cs_main;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&op);
  puVar16 = puVar48;
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar48->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  _height = CONCAT44(uStack_674,
                     (int)((ulong)((long)(pCVar19->m_chain).vChain.
                                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pCVar19->m_chain).vChain.
                                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&op);
  std::filesystem::__cxx11::path::path((path *)&criticalblock36,(path *)&criticalblock32);
  tinyformat::format<int>((string *)&loaded_snapshot_blockhash,"test_snapshot.%d.dat",&height);
  local_220._0_8_ = auStack_210;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)local_220,
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_,
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ +
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&op,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_220
             ,auto_format);
  std::filesystem::__cxx11::path::path((path *)&result,(path *)&op);
  std::filesystem::__cxx11::path::~path((path *)&op);
  if ((undefined1 *)local_220._0_8_ != auStack_210) {
    operator_delete((void *)local_220._0_8_,(ulong)((long)auStack_210 + 1));
  }
  std::filesystem::__cxx11::path::operator/=((path *)&criticalblock36,(path *)&result);
  std::filesystem::__cxx11::path::path(&snapshot_path.super_path,(path *)&criticalblock36);
  std::filesystem::__cxx11::path::~path((path *)&result);
  if ((uchar *)loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)&criticalblock36);
  pFVar20 = fsbridge::fopen((char *)&snapshot_path,"wb");
  total_coins = 0;
  bStack_260 = false;
  uStack_25f = 0;
  local_258 = 0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)puVar16;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffff7e8;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pCVar27;
  AutoFile::AutoFile((AutoFile *)&loaded_snapshot_blockhash,(FILE *)pFVar20,data_xor);
  if (total_coins != 0) {
    operator_delete((void *)total_coins,local_258 - total_coins);
  }
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar48->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  node._M_head_impl =
       (_Impl *)&(this_00->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                 m_node;
  CreateUTXOSnapshot(&result,(NodeContext *)node._M_head_impl,pCVar19,
                     (AutoFile *)&loaded_snapshot_blockhash,&snapshot_path,&snapshot_path);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&op,snapshot_path.super_path._M_pathname._M_dataplus._M_p,
             snapshot_path.super_path._M_pathname._M_dataplus._M_p +
             snapshot_path.super_path._M_pathname._M_string_length);
  ::UniValue::write_abi_cxx11_((UniValue *)local_220,(int)&result,(void *)0x0,0);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file._M_len = 0x66;
  logging_function._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function,source_file,0x35,ALL,Info,(ConstevalFormatString<2U>)0xf54738,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
  if ((undefined1 *)local_220._0_8_ != auStack_210) {
    operator_delete((void *)local_220._0_8_,(ulong)((long)auStack_210 + 1));
  }
  if ((uchar *)op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_,
                    op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  pFVar20 = fsbridge::fopen((char *)&snapshot_path,"rb");
  local_288 = (undefined1  [16])0x0;
  local_278 = 0;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar16;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7e8;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar27;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar20,data_xor_00);
  if ((void *)local_288._0_8_ != (void *)0x0) {
    operator_delete((void *)local_288._0_8_,local_278 - local_288._0_8_);
  }
  MVar2._M_elems =
       *&(((((puVar48->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).chainparams
          )->pchMessageStart)._M_elems;
  local_220._0_2_ = 2;
  __l._M_len = 1;
  __l._M_array = (iterator)local_220;
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)&op,
             __l,(less<unsigned_short> *)&chains_tested,
             (allocator_type *)&coins_missing_from_background);
  local_1b0._12_16_ = (undefined1  [16])0x0;
  local_194 = (undefined1  [16])0x0;
  local_180 = 0;
  local_1b0._8_4_ = MVar2._M_elems;
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&op,&auto_infile);
  SetupSnapshot::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&chains_tested,&auto_infile,(SnapshotMetadata *)&op);
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar48->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar6 = (pCVar19->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar6 ==
      (pCVar19->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar36 = (CBlockIndex *)0x0;
  }
  else {
    pCVar36 = ppCVar6[-1];
  }
  if (pCVar36->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar19->m_chain,pCVar36->pprev);
  }
  ChainstateManager::ActivateSnapshot
            ((Result<CBlockIndex_*> *)local_220,
             (puVar48->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&auto_infile,
             (SnapshotMetadata *)&op,false);
  CChain::SetTip(&pCVar19->m_chain,pCVar36);
  _Var9 = local_1e0;
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)local_220);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&op);
  AutoFile::~AutoFile(&auto_infile);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&result.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.val._M_dataplus._M_p != &result.val.field_2) {
    operator_delete(result.val._M_dataplus._M_p,result.val.field_2._M_allocated_capacity + 1);
  }
  AutoFile::~AutoFile((AutoFile *)&loaded_snapshot_blockhash);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  _cVar51 = 0x76fb59;
  std::filesystem::__cxx11::path::~path((path *)&criticalblock32);
  new_coins = CONCAT71(new_coins._1_7_,_Var9 != '\x01');
  local_458.px = (element_type *)0x0;
  local_458.pn.pi_ = (sp_counted_base *)0x0;
  result._0_8_ = anon_var_dwarf_1e2f0ef;
  result.val._M_dataplus._M_p = "";
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_468 = "";
  pvVar34 = (iterator)0x2;
  pvVar35 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&new_coins,(lazy_ostream *)&op,2,0,WARN,_cVar51,(size_t)&local_470,
             0xf1);
  boost::detail::shared_count::~shared_count(&local_458.pn);
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xf3;
  file_09.m_begin = (iterator)&local_480;
  msg_09.m_end = pvVar35;
  msg_09.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_490,
             msg_09);
  _cVar51 = 0x76fc48;
  ::node::FindSnapshotChainstateDir((optional<fs::path> *)&op,data_dir);
  local_220._0_8_ = CONCAT71(local_220._1_7_,local_1b0[0]) ^ 1;
  local_220._8_8_ = (element_type *)0x0;
  auStack_210 = (undefined1  [8])0x0;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1e2f08f;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
  result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
  result._0_8_ = &PTR__lazy_ostream_01389048;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_498 = "";
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  result.val.field_2._M_allocated_capacity = (size_type)(AutoFile *)&loaded_snapshot_blockhash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_220,(lazy_ostream *)&result,1,0,WARN,_cVar51,
             (size_t)&local_4a0,0xf3);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_210);
  puVar48 = puVar16;
  if (local_1b0[0] == '\x01') {
    local_1b0[0] = '\0';
    std::filesystem::__cxx11::path::~path((path *)&op);
  }
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xf9;
  file_10.m_begin = (iterator)&local_4b0;
  msg_10.m_end = pvVar35;
  msg_10.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4c0,
             msg_10);
  std::filesystem::__cxx11::path::path((path *)&criticalblock32,&__p->super_path);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &cs_main;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&op);
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar16->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  _height = CONCAT44(uStack_674,
                     (int)((ulong)((long)(pCVar19->m_chain).vChain.
                                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pCVar19->m_chain).vChain.
                                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&op);
  std::filesystem::__cxx11::path::path((path *)&criticalblock36,(path *)&criticalblock32);
  tinyformat::format<int>((string *)&loaded_snapshot_blockhash,"test_snapshot.%d.dat",&height);
  local_220._0_8_ = auStack_210;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)local_220,
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_,
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ +
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&op,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_220
             ,auto_format);
  std::filesystem::__cxx11::path::path((path *)&result,(path *)&op);
  std::filesystem::__cxx11::path::~path((path *)&op);
  if ((undefined1 *)local_220._0_8_ != auStack_210) {
    operator_delete((void *)local_220._0_8_,(ulong)((long)auStack_210 + 1));
  }
  std::filesystem::__cxx11::path::operator/=((path *)&criticalblock36,(path *)&result);
  std::filesystem::__cxx11::path::path(&snapshot_path.super_path,(path *)&criticalblock36);
  std::filesystem::__cxx11::path::~path((path *)&result);
  if ((uchar *)loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)&criticalblock36);
  pFVar20 = fsbridge::fopen((char *)&snapshot_path,"wb");
  total_coins = 0;
  bStack_260 = false;
  uStack_25f = 0;
  local_258 = 0;
  data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar48;
  data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7e8;
  data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar27;
  AutoFile::AutoFile((AutoFile *)&loaded_snapshot_blockhash,(FILE *)pFVar20,data_xor_01);
  if (total_coins != 0) {
    operator_delete((void *)total_coins,local_258 - total_coins);
  }
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar16->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CreateUTXOSnapshot(&result,(NodeContext *)node._M_head_impl,pCVar19,
                     (AutoFile *)&loaded_snapshot_blockhash,&snapshot_path,&snapshot_path);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&op,snapshot_path.super_path._M_pathname._M_dataplus._M_p,
             snapshot_path.super_path._M_pathname._M_dataplus._M_p +
             snapshot_path.super_path._M_pathname._M_string_length);
  ::UniValue::write_abi_cxx11_((UniValue *)local_220,(int)&result,(void *)0x0,0);
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file_00._M_len = 0x66;
  logging_function_00._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function_00._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_00,source_file_00,0x35,ALL,Info,(ConstevalFormatString<2U>)0xf54738,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
  if ((undefined1 *)local_220._0_8_ != auStack_210) {
    operator_delete((void *)local_220._0_8_,(ulong)((long)auStack_210 + 1));
  }
  if ((uchar *)op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_,
                    op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  pFVar20 = fsbridge::fopen((char *)&snapshot_path,"rb");
  local_288 = (undefined1  [16])0x0;
  local_278 = 0;
  data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar48;
  data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7e8;
  data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar27;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar20,data_xor_02);
  if ((void *)local_288._0_8_ != (void *)0x0) {
    operator_delete((void *)local_288._0_8_,local_278 - local_288._0_8_);
  }
  MVar2._M_elems =
       *&(((((puVar16->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).chainparams
          )->pchMessageStart)._M_elems;
  local_220._0_2_ = 2;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_220;
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)&op,
             __l_00,(less<unsigned_short> *)&chains_tested,
             (allocator_type *)&coins_missing_from_background);
  local_1b0._12_16_ = (undefined1  [16])0x0;
  local_194 = (undefined1  [16])0x0;
  local_180 = 0;
  local_1b0._8_4_ = MVar2._M_elems;
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&op,&auto_infile);
  local_180 = local_180 + 1;
  puVar16 = puVar48;
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar48->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar6 = (pCVar19->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar6 ==
      (pCVar19->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar36 = (CBlockIndex *)0x0;
  }
  else {
    pCVar36 = ppCVar6[-1];
  }
  if (pCVar36->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar19->m_chain,pCVar36->pprev);
  }
  ChainstateManager::ActivateSnapshot
            ((Result<CBlockIndex_*> *)local_220,
             (puVar48->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&auto_infile,
             (SnapshotMetadata *)&op,false);
  CChain::SetTip(&pCVar19->m_chain,pCVar36);
  _Var9 = local_1e0;
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)local_220);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&op);
  AutoFile::~AutoFile(&auto_infile);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&result.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.val._M_dataplus._M_p != &result.val.field_2) {
    operator_delete(result.val._M_dataplus._M_p,result.val.field_2._M_allocated_capacity + 1);
  }
  AutoFile::~AutoFile((AutoFile *)&loaded_snapshot_blockhash);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  _cVar51 = 0x7701bf;
  std::filesystem::__cxx11::path::~path((path *)&criticalblock32);
  new_coins = CONCAT71(new_coins._1_7_,_Var9 != '\x01');
  local_458.px = (element_type *)0x0;
  local_458.pn.pi_ = (sp_counted_base *)0x0;
  result._0_8_ = anon_var_dwarf_1e2f10a;
  result.val._M_dataplus._M_p = "";
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_4c8 = "";
  pvVar34 = (iterator)0x2;
  pvVar35 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&new_coins,(lazy_ostream *)&op,2,0,WARN,_cVar51,(size_t)&local_4d0,
             0xf9);
  boost::detail::shared_count::~shared_count(&local_458.pn);
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xfe;
  file_11.m_begin = (iterator)&local_4e0;
  msg_11.m_end = pvVar35;
  msg_11.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4f0,
             msg_11);
  std::filesystem::__cxx11::path::path((path *)&criticalblock32,&__p->super_path);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &cs_main;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&op);
  puVar48 = puVar16;
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar16->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  _height = CONCAT44(uStack_674,
                     (int)((ulong)((long)(pCVar19->m_chain).vChain.
                                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pCVar19->m_chain).vChain.
                                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&op);
  std::filesystem::__cxx11::path::path((path *)&criticalblock36,(path *)&criticalblock32);
  tinyformat::format<int>((string *)&loaded_snapshot_blockhash,"test_snapshot.%d.dat",&height);
  local_220._0_8_ = auStack_210;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)local_220,
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_,
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ +
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&op,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_220
             ,auto_format);
  std::filesystem::__cxx11::path::path((path *)&result,(path *)&op);
  std::filesystem::__cxx11::path::~path((path *)&op);
  if ((undefined1 *)local_220._0_8_ != auStack_210) {
    operator_delete((void *)local_220._0_8_,(ulong)((long)auStack_210 + 1));
  }
  std::filesystem::__cxx11::path::operator/=((path *)&criticalblock36,(path *)&result);
  std::filesystem::__cxx11::path::path(&snapshot_path.super_path,(path *)&criticalblock36);
  std::filesystem::__cxx11::path::~path((path *)&result);
  if ((uchar *)loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)&criticalblock36);
  pFVar20 = fsbridge::fopen((char *)&snapshot_path,"wb");
  total_coins = 0;
  bStack_260 = false;
  uStack_25f = 0;
  local_258 = 0;
  data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar48;
  data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7e8;
  data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar27;
  AutoFile::AutoFile((AutoFile *)&loaded_snapshot_blockhash,(FILE *)pFVar20,data_xor_03);
  if (total_coins != 0) {
    operator_delete((void *)total_coins,local_258 - total_coins);
  }
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar16->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CreateUTXOSnapshot(&result,(NodeContext *)node._M_head_impl,pCVar19,
                     (AutoFile *)&loaded_snapshot_blockhash,&snapshot_path,&snapshot_path);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&op,snapshot_path.super_path._M_pathname._M_dataplus._M_p,
             snapshot_path.super_path._M_pathname._M_dataplus._M_p +
             snapshot_path.super_path._M_pathname._M_string_length);
  ::UniValue::write_abi_cxx11_((UniValue *)local_220,(int)&result,(void *)0x0,0);
  source_file_01._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file_01._M_len = 0x66;
  logging_function_01._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function_01._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_01,source_file_01,0x35,ALL,Info,(ConstevalFormatString<2U>)0xf54738,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
  if ((undefined1 *)local_220._0_8_ != auStack_210) {
    operator_delete((void *)local_220._0_8_,(ulong)((long)auStack_210 + 1));
  }
  if ((uchar *)op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_,
                    op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  pFVar20 = fsbridge::fopen((char *)&snapshot_path,"rb");
  local_288 = (undefined1  [16])0x0;
  local_278 = 0;
  data_xor_04.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar48;
  data_xor_04.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7e8;
  data_xor_04.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar27;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar20,data_xor_04);
  if ((void *)local_288._0_8_ != (void *)0x0) {
    operator_delete((void *)local_288._0_8_,local_278 - local_288._0_8_);
  }
  MVar2._M_elems =
       *&(((((puVar16->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).chainparams
          )->pchMessageStart)._M_elems;
  local_220._0_2_ = 2;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_220;
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)&op,
             __l_01,(less<unsigned_short> *)&chains_tested,
             (allocator_type *)&coins_missing_from_background);
  local_1b0._12_16_ = (undefined1  [16])0x0;
  local_194 = (undefined1  [16])0x0;
  local_180 = 0;
  local_1b0._8_4_ = MVar2._M_elems;
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&op,&auto_infile);
  local_180 = local_180 - 1;
  puVar16 = puVar48;
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar48->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar6 = (pCVar19->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar6 ==
      (pCVar19->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar36 = (CBlockIndex *)0x0;
  }
  else {
    pCVar36 = ppCVar6[-1];
  }
  if (pCVar36->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar19->m_chain,pCVar36->pprev);
  }
  ChainstateManager::ActivateSnapshot
            ((Result<CBlockIndex_*> *)local_220,
             (puVar48->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&auto_infile,
             (SnapshotMetadata *)&op,false);
  CChain::SetTip(&pCVar19->m_chain,pCVar36);
  _Var9 = local_1e0;
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)local_220);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&op);
  AutoFile::~AutoFile(&auto_infile);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&result.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.val._M_dataplus._M_p != &result.val.field_2) {
    operator_delete(result.val._M_dataplus._M_p,result.val.field_2._M_allocated_capacity + 1);
  }
  AutoFile::~AutoFile((AutoFile *)&loaded_snapshot_blockhash);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  _cVar51 = 0x770725;
  std::filesystem::__cxx11::path::~path((path *)&criticalblock32);
  new_coins = CONCAT71(new_coins._1_7_,_Var9 != '\x01');
  local_458.px = (element_type *)0x0;
  local_458.pn.pi_ = (sp_counted_base *)0x0;
  result._0_8_ = anon_var_dwarf_1e2f124;
  result.val._M_dataplus._M_p = "";
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_4f8 = "";
  pvVar34 = (iterator)0x2;
  pvVar35 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&new_coins,(lazy_ostream *)&op,2,0,WARN,_cVar51,(size_t)&local_500,
             0xfe);
  boost::detail::shared_count::~shared_count(&local_458.pn);
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x103;
  file_12.m_begin = (iterator)&local_510;
  msg_12.m_end = pvVar35;
  msg_12.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_520,
             msg_12);
  std::filesystem::__cxx11::path::path((path *)&criticalblock32,&__p->super_path);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &cs_main;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&op);
  puVar48 = puVar16;
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar16->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  _height = CONCAT44(uStack_674,
                     (int)((ulong)((long)(pCVar19->m_chain).vChain.
                                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pCVar19->m_chain).vChain.
                                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&op);
  std::filesystem::__cxx11::path::path((path *)&criticalblock36,(path *)&criticalblock32);
  tinyformat::format<int>((string *)&loaded_snapshot_blockhash,"test_snapshot.%d.dat",&height);
  local_220._0_8_ = auStack_210;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)local_220,
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_,
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ +
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&op,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_220
             ,auto_format);
  std::filesystem::__cxx11::path::path((path *)&result,(path *)&op);
  std::filesystem::__cxx11::path::~path((path *)&op);
  if ((undefined1 *)local_220._0_8_ != auStack_210) {
    operator_delete((void *)local_220._0_8_,(ulong)((long)auStack_210 + 1));
  }
  std::filesystem::__cxx11::path::operator/=((path *)&criticalblock36,(path *)&result);
  std::filesystem::__cxx11::path::path(&snapshot_path.super_path,(path *)&criticalblock36);
  std::filesystem::__cxx11::path::~path((path *)&result);
  if ((uchar *)loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)&criticalblock36);
  pFVar20 = fsbridge::fopen((char *)&snapshot_path,"wb");
  total_coins = 0;
  bStack_260 = false;
  uStack_25f = 0;
  local_258 = 0;
  data_xor_05.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar48;
  data_xor_05.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7e8;
  data_xor_05.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar27;
  AutoFile::AutoFile((AutoFile *)&loaded_snapshot_blockhash,(FILE *)pFVar20,data_xor_05);
  if (total_coins != 0) {
    operator_delete((void *)total_coins,local_258 - total_coins);
  }
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar16->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CreateUTXOSnapshot(&result,(NodeContext *)node._M_head_impl,pCVar19,
                     (AutoFile *)&loaded_snapshot_blockhash,&snapshot_path,&snapshot_path);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&op,snapshot_path.super_path._M_pathname._M_dataplus._M_p,
             snapshot_path.super_path._M_pathname._M_dataplus._M_p +
             snapshot_path.super_path._M_pathname._M_string_length);
  ::UniValue::write_abi_cxx11_((UniValue *)local_220,(int)&result,(void *)0x0,0);
  source_file_02._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file_02._M_len = 0x66;
  logging_function_02._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function_02._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_02,source_file_02,0x35,ALL,Info,(ConstevalFormatString<2U>)0xf54738,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
  if ((undefined1 *)local_220._0_8_ != auStack_210) {
    operator_delete((void *)local_220._0_8_,(ulong)((long)auStack_210 + 1));
  }
  if ((uchar *)op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_,
                    op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  pFVar20 = fsbridge::fopen((char *)&snapshot_path,"rb");
  local_288 = (undefined1  [16])0x0;
  local_278 = 0;
  data_xor_06.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar48;
  data_xor_06.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7e8;
  data_xor_06.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar27;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar20,data_xor_06);
  if ((void *)local_288._0_8_ != (void *)0x0) {
    operator_delete((void *)local_288._0_8_,local_278 - local_288._0_8_);
  }
  MVar2._M_elems =
       *&(((((puVar16->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).chainparams
          )->pchMessageStart)._M_elems;
  local_220._0_2_ = 2;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_220;
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)&op,
             __l_02,(less<unsigned_short> *)&chains_tested,
             (allocator_type *)&coins_missing_from_background);
  local_1b0._12_16_ = (undefined1  [16])0x0;
  local_194 = (undefined1  [16])0x0;
  local_180 = 0;
  local_1b0._8_4_ = MVar2._M_elems;
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&op,&auto_infile);
  local_194 = ZEXT816(0);
  local_1b0._12_16_ = ZEXT816(0);
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar48->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar6 = (pCVar19->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar6 ==
      (pCVar19->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar36 = (CBlockIndex *)0x0;
  }
  else {
    pCVar36 = ppCVar6[-1];
  }
  if (pCVar36->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar19->m_chain,pCVar36->pprev);
  }
  ChainstateManager::ActivateSnapshot
            ((Result<CBlockIndex_*> *)local_220,
             (puVar48->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&auto_infile,
             (SnapshotMetadata *)&op,false);
  CChain::SetTip(&pCVar19->m_chain,pCVar36);
  _Var9 = local_1e0;
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)local_220);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&op);
  AutoFile::~AutoFile(&auto_infile);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&result.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.val._M_dataplus._M_p != &result.val.field_2) {
    operator_delete(result.val._M_dataplus._M_p,result.val.field_2._M_allocated_capacity + 1);
  }
  AutoFile::~AutoFile((AutoFile *)&loaded_snapshot_blockhash);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  _cVar51 = 0x770ca8;
  std::filesystem::__cxx11::path::~path((path *)&criticalblock32);
  new_coins = CONCAT71(new_coins._1_7_,_Var9 != '\x01');
  local_458.px = (element_type *)0x0;
  local_458.pn.pi_ = (sp_counted_base *)0x0;
  result._0_8_ = anon_var_dwarf_1e2f130;
  result.val._M_dataplus._M_p = "";
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_528 = "";
  pvVar34 = (iterator)0x2;
  pvVar35 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&new_coins,(lazy_ostream *)&op,2,0,WARN,_cVar51,(size_t)&local_530,
             0x103);
  boost::detail::shared_count::~shared_count(&local_458.pn);
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x108;
  file_13.m_begin = (iterator)&local_540;
  msg_13.m_end = pvVar35;
  msg_13.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_550,
             msg_13);
  std::filesystem::__cxx11::path::path((path *)&criticalblock32,&__p->super_path);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &cs_main;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&op);
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar48->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  _height = CONCAT44(uStack_674,
                     (int)((ulong)((long)(pCVar19->m_chain).vChain.
                                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pCVar19->m_chain).vChain.
                                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&op);
  std::filesystem::__cxx11::path::path((path *)&criticalblock36,(path *)&criticalblock32);
  tinyformat::format<int>((string *)&loaded_snapshot_blockhash,"test_snapshot.%d.dat",&height);
  local_220._0_8_ = auStack_210;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)local_220,
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_,
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ +
             loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&op,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_220
             ,auto_format);
  std::filesystem::__cxx11::path::path((path *)&result,(path *)&op);
  std::filesystem::__cxx11::path::~path((path *)&op);
  if ((undefined1 *)local_220._0_8_ != auStack_210) {
    operator_delete((void *)local_220._0_8_,(ulong)((long)auStack_210 + 1));
  }
  std::filesystem::__cxx11::path::operator/=((path *)&criticalblock36,(path *)&result);
  std::filesystem::__cxx11::path::path(&snapshot_path.super_path,(path *)&criticalblock36);
  std::filesystem::__cxx11::path::~path((path *)&result);
  if ((uchar *)loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)&criticalblock36);
  pFVar20 = fsbridge::fopen((char *)&snapshot_path,"wb");
  total_coins = 0;
  bStack_260 = false;
  uStack_25f = 0;
  local_258 = 0;
  data_xor_07.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar48;
  data_xor_07.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7e8;
  data_xor_07.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar27;
  AutoFile::AutoFile((AutoFile *)&loaded_snapshot_blockhash,(FILE *)pFVar20,data_xor_07);
  if (total_coins != 0) {
    operator_delete((void *)total_coins,local_258 - total_coins);
  }
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar48->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CreateUTXOSnapshot(&result,(NodeContext *)node._M_head_impl,pCVar19,
                     (AutoFile *)&loaded_snapshot_blockhash,&snapshot_path,&snapshot_path);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&op,snapshot_path.super_path._M_pathname._M_dataplus._M_p,
             snapshot_path.super_path._M_pathname._M_dataplus._M_p +
             snapshot_path.super_path._M_pathname._M_string_length);
  ::UniValue::write_abi_cxx11_((UniValue *)local_220,(int)&result,(void *)0x0,0);
  source_file_03._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file_03._M_len = 0x66;
  logging_function_03._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function_03._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_03,source_file_03,0x35,ALL,Info,(ConstevalFormatString<2U>)0xf54738,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
  if ((undefined1 *)local_220._0_8_ != auStack_210) {
    operator_delete((void *)local_220._0_8_,(ulong)((long)auStack_210 + 1));
  }
  if ((uchar *)op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_,
                    op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  pFVar20 = fsbridge::fopen((char *)&snapshot_path,"rb");
  local_288 = (undefined1  [16])0x0;
  local_278 = 0;
  data_xor_08.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar48;
  data_xor_08.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7e8;
  data_xor_08.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar27;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar20,data_xor_08);
  if ((void *)local_288._0_8_ != (void *)0x0) {
    operator_delete((void *)local_288._0_8_,local_278 - local_288._0_8_);
  }
  MVar2._M_elems =
       *&(((((puVar48->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).chainparams
          )->pchMessageStart)._M_elems;
  local_220._0_2_ = 2;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_220;
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)&op,
             __l_03,(less<unsigned_short> *)&chains_tested,
             (allocator_type *)&coins_missing_from_background);
  local_1b0._12_16_ = (undefined1  [16])0x0;
  local_194 = (undefined1  [16])0x0;
  local_180 = 0;
  local_1b0._8_4_ = MVar2._M_elems;
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&op,&auto_infile);
  local_194 = ZEXT816(0);
  local_1b0._12_16_ = ZEXT816((ulong)1);
  puVar16 = puVar48;
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((puVar48->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar6 = (pCVar19->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar6 ==
      (pCVar19->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar36 = (CBlockIndex *)0x0;
  }
  else {
    pCVar36 = ppCVar6[-1];
  }
  if (pCVar36->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar19->m_chain,pCVar36->pprev);
  }
  ChainstateManager::ActivateSnapshot
            ((Result<CBlockIndex_*> *)local_220,
             (puVar48->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&auto_infile,
             (SnapshotMetadata *)&op,false);
  CChain::SetTip(&pCVar19->m_chain,pCVar36);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)local_220);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&op);
  AutoFile::~AutoFile(&auto_infile);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&result.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.val._M_dataplus._M_p != &result.val.field_2) {
    operator_delete(result.val._M_dataplus._M_p,result.val.field_2._M_allocated_capacity + 1);
  }
  AutoFile::~AutoFile((AutoFile *)&loaded_snapshot_blockhash);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  _cVar51 = 0x771229;
  std::filesystem::__cxx11::path::~path((path *)&criticalblock32);
  new_coins = CONCAT71(new_coins._1_7_,local_1e0 != '\x01');
  local_458.px = (element_type *)0x0;
  local_458.pn.pi_ = (sp_counted_base *)0x0;
  result._0_8_ = anon_var_dwarf_1e2f14a;
  result.val._M_dataplus._M_p = "";
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_558 = "";
  pvVar34 = (iterator)0x2;
  pvVar35 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&new_coins,(lazy_ostream *)&op,2,0,WARN,_cVar51,(size_t)&local_560,
             0x108);
  boost::detail::shared_count::~shared_count(&local_458.pn);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x10a;
  file_14.m_begin = (iterator)&local_570;
  msg_14.m_end = pvVar35;
  msg_14.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_580,
             msg_14);
  _cVar51 = 0x77130d;
  bVar11 = CreateAndActivateUTXOSnapshot<__25_const>(this_00);
  result.typ._0_1_ = bVar11;
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  local_220._0_8_ = (long)"!CreateAndActivateUTXOSnapshot(this)" + 1;
  local_220._8_8_ = (element_type *)0xf563df;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_588 = "";
  pvVar34 = (iterator)0x2;
  pvVar35 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       (_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)local_220;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,2,0,WARN,_cVar51,(size_t)&local_590,
             0x10a);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x10b;
  file_15.m_begin = (iterator)&local_5a0;
  msg_15.m_end = pvVar35;
  msg_15.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_5b0,
             msg_15);
  ::node::FindSnapshotChainstateDir((optional<fs::path> *)&op,data_dir);
  _cVar51 = 0x7713df;
  cVar12 = std::filesystem::status((path *)&op);
  local_220[0] = cVar12 != -1 && cVar12 != '\0';
  local_220._8_8_ = (element_type *)0x0;
  auStack_210 = (undefined1  [8])0x0;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1e2f172;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
  result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
  result._0_8_ = &PTR__lazy_ostream_01389048;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (size_type)&loaded_snapshot_blockhash;
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_5b8 = "";
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_220,(lazy_ostream *)&result,1,0,WARN,_cVar51,
             (size_t)&local_5c0,0x10b);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_210);
  if (local_1b0[0] == '\x01') {
    local_1b0[0] = '\0';
    std::filesystem::__cxx11::path::~path((path *)&op);
  }
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x10e;
  file_16.m_begin = (iterator)&local_5d0;
  msg_16.m_end = pvVar35;
  msg_16.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_5e0,
             msg_16);
  pCVar49 = pCVar27;
  pCVar19 = ChainstateManager::ActiveChainstate(pCVar27);
  pbVar37 = &(pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
             _M_payload.super__Optional_payload_base<uint256>._M_engaged;
  _cVar51 = 0x771506;
  puVar21 = std::
            __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                      (&pCVar19->m_from_snapshot_blockhash,pbVar37);
  result.typ._0_1_ = (bool *)puVar21 != pbVar37;
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  local_220._0_8_ = "!chainman.ActiveChainstate().m_from_snapshot_blockhash->IsNull()";
  local_220._8_8_ = (element_type *)0xf567d7;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = local_220;
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_5e8 = "";
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,1,0,WARN,_cVar51,(size_t)&local_5f0,
             0x10e);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_5f8 = "";
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x111;
  file_17.m_begin = (iterator)&local_600;
  msg_17.m_end = pvVar35;
  msg_17.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_610,
             msg_17);
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._9_8_ << 8;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       &PTR__lazy_ostream_01388f08;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  pCVar19 = ChainstateManager::ActiveChainstate(pCVar27);
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)&op,pCVar27);
  snapshot_path.super_path._M_pathname._M_dataplus._M_p =
       (pointer)&pCVar19->m_from_snapshot_blockhash;
  auVar1 = *(undefined1 (*) [16])
            ((long)&(pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                    _M_payload.super__Optional_payload_base<uint256>._M_payload + 0x10);
  auVar45[0] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] == auVar1[0]);
  auVar45[1] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] == auVar1[1]);
  auVar45[2] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] == auVar1[2]);
  auVar45[3] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] == auVar1[3]);
  auVar45[4] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] == auVar1[4]);
  auVar45[5] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] == auVar1[5]);
  auVar45[6] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] == auVar1[6]);
  auVar45[7] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] == auVar1[7]);
  auVar45[8] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] == auVar1[8]);
  auVar45[9] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] == auVar1[9]);
  auVar45[10] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] == auVar1[10]);
  auVar45[0xb] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] == auVar1[0xb]);
  auVar45[0xc] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] == auVar1[0xc]);
  auVar45[0xd] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] == auVar1[0xd]);
  auVar45[0xe] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] == auVar1[0xe]);
  auVar45[0xf] = -(op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] == auVar1[0xf]);
  auVar41[0] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                 _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                 super_base_blob<256U>.m_data._M_elems[0] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar41[1] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                 _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                 super_base_blob<256U>.m_data._M_elems[1] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar41[2] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                 _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                 super_base_blob<256U>.m_data._M_elems[2] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar41[3] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                 _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                 super_base_blob<256U>.m_data._M_elems[3] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar41[4] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                 _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                 super_base_blob<256U>.m_data._M_elems[4] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar41[5] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                 _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                 super_base_blob<256U>.m_data._M_elems[5] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar41[6] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                 _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                 super_base_blob<256U>.m_data._M_elems[6] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar41[7] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                 _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                 super_base_blob<256U>.m_data._M_elems[7] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar41[8] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                 _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                 super_base_blob<256U>.m_data._M_elems[8] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar41[9] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                 _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                 super_base_blob<256U>.m_data._M_elems[9] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar41[10] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                  _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                  super_base_blob<256U>.m_data._M_elems[10] ==
                 op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar41[0xb] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                   _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                   super_base_blob<256U>.m_data._M_elems[0xb] ==
                  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar41[0xc] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                   _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                   super_base_blob<256U>.m_data._M_elems[0xc] ==
                  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar41[0xd] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                   _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                   super_base_blob<256U>.m_data._M_elems[0xd] ==
                  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar41[0xe] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                   _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                   super_base_blob<256U>.m_data._M_elems[0xe] ==
                  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar41[0xf] = -((pCVar19->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                   _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                   super_base_blob<256U>.m_data._M_elems[0xf] ==
                  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar41 = auVar41 & auVar45;
  auto_infile.m_file =
       (FILE *)CONCAT71(auto_infile.m_file._1_7_,
                        (ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) == 0xffff);
  auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  criticalblock32.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1e215e9;
  criticalblock32.super_unique_lock._8_8_ = (element_type *)0xf54b3e;
  result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
  result._0_8_ = &PTR__lazy_ostream_01389a00;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (size_type)&snapshot_path;
  local_220._8_8_ = local_220._9_8_ << 8;
  local_220._0_8_ = &PTR__lazy_ostream_01389a00;
  auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  aaStack_208[0]._0_8_ = &criticalblock36;
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  criticalblock36.super_unique_lock._M_device = (mutex_type *)&op;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&auto_infile,(lazy_ostream *)&loaded_snapshot_blockhash,1,2,REQUIRE
             ,0xf567d8,(size_t)&criticalblock32,0x111,&result,"*chainman.SnapshotBlockhash()",
             local_220);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish);
  pCVar19 = ChainstateManager::ActiveChainstate(pCVar49);
  _total_coins = (unkuint9)0x139c540;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&total_coins);
  ::node::FindSnapshotChainstateDir((optional<fs::path> *)&op,data_dir);
  std::filesystem::__cxx11::path::path((path *)&result,(path *)&op);
  if (local_1b0[0] == '\x01') {
    local_1b0[0] = '\0';
    std::filesystem::__cxx11::path::~path((path *)&op);
  }
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x11d;
  file_18.m_begin = (iterator)&local_620;
  msg_18.m_end = pvVar35;
  msg_18.m_begin = pvVar34;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_630,
             msg_18);
  criticalblock32.super_unique_lock._8_8_ = criticalblock32._9_8_ << 8;
  criticalblock32.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01388f08;
  aStack_50._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_50._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  std::filesystem::__cxx11::path::path(&local_248,(path *)&result);
  chaindir.super_path._M_pathname._M_string_length = (size_type)puVar16;
  chaindir.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7e8;
  chaindir.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)pCVar49;
  chaindir.super_path._M_pathname.field_2._8_8_ = this_00;
  chaindir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )node._M_head_impl;
  ::node::ReadSnapshotBaseBlockhash((optional<uint256> *)&op,chaindir);
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)local_220,pCVar49);
  auVar43[0] = -(local_220[0] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar43[1] = -(local_220[1] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar43[2] = -(local_220[2] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar43[3] = -(local_220[3] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar43[4] = -(local_220[4] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar43[5] = -(local_220[5] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar43[6] = -(local_220[6] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar43[7] = -(local_220[7] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar43[8] = -(local_220[8] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar43[9] = -(local_220[9] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar43[10] = -(local_220[10] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar43[0xb] = -(local_220[0xb] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar43[0xc] = -(local_220[0xc] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar43[0xd] = -(local_220[0xd] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar43[0xe] = -(local_220[0xe] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar43[0xf] = -(local_220[0xf] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar46[0] = -(auStack_210[0] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar46[1] = -(auStack_210[1] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar46[2] = -(auStack_210[2] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar46[3] = -(auStack_210[3] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar46[4] = -(auStack_210[4] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar46[5] = -(auStack_210[5] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar46[6] = -(auStack_210[6] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar46[7] = -(auStack_210[7] == op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar46[8] = -(aaStack_208[0]._M_local_buf[0] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar46[9] = -(aaStack_208[0]._M_local_buf[1] ==
                op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar46[10] = -(aaStack_208[0]._M_local_buf[2] ==
                 op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar46[0xb] = -(aaStack_208[0]._M_local_buf[3] ==
                  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar46[0xc] = -(aaStack_208[0]._M_local_buf[4] ==
                  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar46[0xd] = -(aaStack_208[0]._M_local_buf[5] ==
                  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar46[0xe] = -(aaStack_208[0]._M_local_buf[6] ==
                  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar46[0xf] = -(aaStack_208[0]._M_local_buf[7] ==
                  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar43 = auVar43 & auVar46;
  snapshot_path.super_path._M_pathname._M_dataplus._M_p._0_1_ =
       (ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) | (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar43[0xf] >> 7) << 0xf) == 0xffff;
  snapshot_path.super_path._M_pathname._8_16_ = (undefined1  [16])0x0;
  criticalblock36.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1e215e9;
  criticalblock36.super_unique_lock._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b;
  local_288._0_8_ = &op;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._9_8_ << 8;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       &PTR__lazy_ostream_01389a00;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ = local_288;
  auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                 .super__Vector_impl_data._1_8_ << 8);
  auto_infile.m_file = (FILE *)&PTR__lazy_ostream_01389a00;
  auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&new_coins;
  pvVar34 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  new_coins = (size_t)local_220;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&snapshot_path,(lazy_ostream *)&criticalblock32,1,2,REQUIRE,
             0xf5682d,(size_t)&criticalblock36,0x11d,(lazy_ostream *)&loaded_snapshot_blockhash,
             "*chainman.SnapshotBlockhash()",&auto_infile);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&snapshot_path.super_path._M_pathname.field_2._M_allocated_capacity);
  std::filesystem::__cxx11::path::~path(&local_248);
  std::filesystem::__cxx11::path::~path((path *)&result);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&total_coins);
  pCVar22 = Params();
  pAVar29 = (pCVar22->m_assumeutxo_data).
            super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pAVar29 ==
        (pCVar22->m_assumeutxo_data).
        super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar13 = 0;
LAB_00771a17:
      local_194[0xc] = uVar13;
      result._0_8_ = &cs_main;
      auVar7[0xf] = 0;
      auVar7._0_15_ = (undefined1  [15])result.val._1_15_;
      result.val._0_16_ = auVar7 << 8;
      pCVar27 = pCVar49;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&result);
      pCVar23 = ChainstateManager::ActiveChainstate(pCVar49);
      ppCVar6 = (pCVar23->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar6 ==
          (pCVar23->m_chain).vChain.
          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pCVar36 = (CBlockIndex *)0x0;
      }
      else {
        pCVar36 = ppCVar6[-1];
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&result);
      local_640 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_638 = "";
      local_650 = &boost::unit_test::basic_cstring<char_const>::null;
      local_648 = &boost::unit_test::basic_cstring<char_const>::null;
      file_19.m_end = (iterator)0x123;
      file_19.m_begin = (iterator)&local_640;
      msg_19.m_end = pvVar35;
      msg_19.m_begin = pvVar34;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_650,
                 msg_19);
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._9_8_ << 8;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           &PTR__lazy_ostream_01388f08;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           boost::unit_test::lazy_ostream::inst;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           (long)"\x05\x04\x03\x02\x01" + 5;
      criticalblock36.super_unique_lock._M_device = (mutex_type *)local_1b0;
      snapshot_path.super_path._M_pathname._M_dataplus._M_p = (pointer)&pCVar36->m_chain_tx_count;
      auto_infile.m_file =
           (FILE *)CONCAT71(auto_infile.m_file._1_7_,
                            pCVar36->m_chain_tx_count == CONCAT71(local_1b0._1_7_,local_1b0[0]));
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      criticalblock32.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1e215e9;
      criticalblock32.super_unique_lock._8_8_ = (element_type *)0xf54b3e;
      result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
      result._0_8_ = &PTR__lazy_ostream_01388f48;
      result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
      local_220._8_8_ = local_220._9_8_ << 8;
      local_220._0_8_ = &PTR__lazy_ostream_01388f48;
      auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      aaStack_208[0]._0_8_ = &criticalblock36;
      pvVar34 = (iterator)0x1;
      pvVar35 = (iterator)0x2;
      result.val.field_2._M_allocated_capacity = (size_type)(assertion_result *)&snapshot_path;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&auto_infile,(lazy_ostream *)&loaded_snapshot_blockhash,1,2,
                 REQUIRE,0xf56855,(size_t)&criticalblock32,0x123,&result,"au_data->m_chain_tx_count"
                 ,local_220);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
      pCVar49 = pCVar27;
      ChainstateManager::SnapshotBlockhash((optional<uint256> *)&result,pCVar27);
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x18] =
           result.val.field_2._0_1_;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x19] =
           result.val.field_2._1_1_;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] =
           result.val.field_2._2_1_;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] =
           result.val.field_2._3_1_;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] =
           result.val.field_2._4_1_;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] =
           result.val.field_2._5_1_;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] =
           result.val.field_2._6_1_;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] =
           result.val.field_2._7_1_;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = result._0_8_;
      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_16_ = result.val._0_16_;
      _total_coins = (unkuint9)0x139c540;
      std::unique_lock<std::recursive_mutex>::lock
                ((unique_lock<std::recursive_mutex> *)&total_coins);
      _chains_tested = (ulong)(uint)uStack_70c << 0x20;
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&snapshot_path,pCVar27);
      if (snapshot_path.super_path._M_pathname._M_dataplus._M_p !=
          (pointer)snapshot_path.super_path._M_pathname._M_string_length) {
        _Var31 = snapshot_path.super_path._M_pathname._M_dataplus;
        pCVar27 = pCVar49;
        pcVar50 = (pointer)snapshot_path.super_path._M_pathname._M_string_length;
        do {
          pCVar23 = *(Chainstate **)_Var31._M_p;
          criticalblock32.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1e215e9;
          aStack_50._M_allocated_capacity = (size_type)(sp_counted_base *)0x130;
          criticalblock32.super_unique_lock._8_8_ = (element_type *)0xf54b3e;
          puVar24 = boost::unit_test::unit_test_log_t::operator<<
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,
                               (begin *)&criticalblock32);
          boost::unit_test::unit_test_log_t::operator()
                    ((unit_test_log_t *)&criticalblock36,(log_level)puVar24);
          local_220._8_8_ = local_220._9_8_ << 8;
          local_220._0_8_ = &PTR__lazy_ostream_0138e9f8;
          auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
          aaStack_208[0]._M_allocated_capacity = "Checking coins in ";
          Chainstate::ToString_abi_cxx11_((string *)&auto_infile,pCVar23);
          result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
          result._0_8_ = &PTR__lazy_ostream_0138e9b8;
          result.val._M_string_length = (size_type)local_220;
          result.val.field_2._M_allocated_capacity = (size_type)&auto_infile;
          boost::unit_test::ut_detail::entry_value_collector::operator<<
                    ((entry_value_collector *)&criticalblock36,(lazy_ostream *)&result);
          if (auto_infile.m_file !=
              (FILE *)&auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                       _M_impl.super__Vector_impl_data._M_finish) {
            operator_delete(auto_infile.m_file,
                            (ulong)(auto_infile.m_xor.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 1));
          }
          boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                    ((entry_value_collector *)&criticalblock36);
          pCVar18 = Chainstate::CoinsTip(pCVar23);
          local_660 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_658 = "";
          local_670 = &boost::unit_test::basic_cstring<char_const>::null;
          local_668 = &boost::unit_test::basic_cstring<char_const>::null;
          file_20.m_end = (iterator)0x134;
          file_20.m_begin = (iterator)&local_660;
          msg_20.m_end = pvVar35;
          msg_20.m_begin = pvVar34;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                     (size_t)&local_670,msg_20);
          auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                         ._M_impl.super__Vector_impl_data._1_8_ << 8);
          auto_infile.m_file = (FILE *)&PTR__lazy_ostream_01388f08;
          auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
          auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0xf4aea1;
          _height = _height & 0xffffffff00000000;
          uVar14 = CCoinsViewCache::GetCacheSize(pCVar18);
          coins_missing_from_background = CONCAT44(coins_missing_from_background._4_4_,uVar14);
          criticalblock32.super_unique_lock._M_device =
               (mutex_type *)
               CONCAT71(criticalblock32.super_unique_lock._M_device._1_7_,height == uVar14);
          criticalblock32.super_unique_lock._8_8_ = (element_type *)0x0;
          aStack_50._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
          criticalblock36.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1e215e9;
          criticalblock36.super_unique_lock._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
               + 0x7b;
          local_288._0_8_ = &height;
          result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
          result._0_8_ = &PTR__lazy_ostream_01388f88;
          result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
          result.val.field_2._M_allocated_capacity = (size_type)local_288;
          new_coins = (size_t)&coins_missing_from_background;
          local_220._8_8_ = local_220._9_8_ << 8;
          local_220._0_8_ = &PTR__lazy_ostream_01388f88;
          auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
          aaStack_208[0]._0_8_ = &new_coins;
          pvVar34 = (iterator)0x1;
          pvVar35 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&criticalblock32,(lazy_ostream *)&auto_infile,1,2,REQUIRE,
                     0xf56898,(size_t)&criticalblock36,0x134,&result,"coinscache.GetCacheSize()",
                     local_220);
          boost::detail::shared_count::~shared_count((shared_count *)&aStack_50);
          _height = 0;
          psVar4 = (this_00->m_coinbase_txns).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar39 = (this_00->m_coinbase_txns).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; psVar39 != psVar4;
              psVar39 = psVar39 + 1) {
            peVar5 = (psVar39->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            result._0_8_ = *(undefined8 *)
                            (peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            result.val._0_16_ =
                 *(undefined1 (*) [16])
                  ((peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            result.val.field_2._M_allocated_capacity =
                 *(undefined8 *)
                  ((peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            result.val.field_2._8_4_ = 0;
            local_688 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
            ;
            local_680 = "";
            local_698 = &boost::unit_test::basic_cstring<char_const>::null;
            local_690 = &boost::unit_test::basic_cstring<char_const>::null;
            file_21.m_end = (iterator)0x13a;
            file_21.m_begin = (iterator)&local_688;
            msg_21.m_end = pvVar35;
            msg_21.m_begin = pvVar34;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,
                       (size_t)&local_698,msg_21);
            _cVar51 = 0x771fe1;
            iVar15 = (*(pCVar18->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                               (pCVar18,&result);
            auto_infile.m_file = (FILE *)CONCAT71(auto_infile.m_file._1_7_,(char)iVar15);
            auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            criticalblock32.super_unique_lock._M_device = (mutex_type *)0xf56382;
            criticalblock32.super_unique_lock._8_8_ = (element_type *)0xf56399;
            local_220._8_8_ = local_220._9_8_ << 8;
            local_220._0_8_ = &PTR__lazy_ostream_01389048;
            auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
            aaStack_208[0]._0_8_ = &criticalblock32;
            local_6a8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
            ;
            local_6a0 = "";
            pvVar34 = (iterator)0x1;
            pvVar35 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&auto_infile,(lazy_ostream *)local_220,1,0,WARN,_cVar51,
                       (size_t)&local_6a8,0x13a);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)
                       &auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
            _height = _height + 1;
          }
          local_6b8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_6b0 = "";
          local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_22.m_end = (iterator)0x13e;
          file_22.m_begin = (iterator)&local_6b8;
          msg_22.m_end = pvVar35;
          msg_22.m_begin = pvVar34;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
                     (size_t)&local_6c8,msg_22);
          auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                         ._M_impl.super__Vector_impl_data._1_8_ << 8);
          auto_infile.m_file = (FILE *)&PTR__lazy_ostream_01388f08;
          auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
          auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0xf4aea1;
          uVar14 = CCoinsViewCache::GetCacheSize(pCVar18);
          coins_missing_from_background = CONCAT44(coins_missing_from_background._4_4_,uVar14);
          criticalblock32.super_unique_lock._M_device =
               (mutex_type *)
               CONCAT71(criticalblock32.super_unique_lock._M_device._1_7_,initial_size == uVar14);
          criticalblock32.super_unique_lock._8_8_ = (element_type *)0x0;
          aStack_50._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
          criticalblock36.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1e215e9;
          criticalblock36.super_unique_lock._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
               + 0x7b;
          result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
          result._0_8_ = &PTR__lazy_ostream_01388f48;
          result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
          result.val.field_2._M_allocated_capacity = (size_type)local_288;
          new_coins = (size_t)&coins_missing_from_background;
          local_220._8_8_ = local_220._9_8_ << 8;
          local_220._0_8_ = &PTR__lazy_ostream_01388f88;
          auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
          aaStack_208[0]._0_8_ = &new_coins;
          pvVar34 = (iterator)0x1;
          pvVar35 = (iterator)0x2;
          local_288._0_8_ = &initial_size;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&criticalblock32,(lazy_ostream *)&auto_infile,1,2,REQUIRE,
                     0xf563ae,(size_t)&criticalblock36,0x13e,&result,"coinscache.GetCacheSize()",
                     local_220);
          boost::detail::shared_count::~shared_count((shared_count *)&aStack_50);
          local_6d8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_6d0 = "";
          local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_23.m_end = (iterator)0x13f;
          file_23.m_begin = (iterator)&local_6d8;
          msg_23.m_end = pvVar35;
          msg_23.m_begin = pvVar34;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,
                     (size_t)&local_6e8,msg_23);
          auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                         ._M_impl.super__Vector_impl_data._1_8_ << 8);
          auto_infile.m_file = (FILE *)&PTR__lazy_ostream_01388f08;
          auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
          auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0xf4aea1;
          criticalblock32.super_unique_lock._M_device =
               (mutex_type *)
               CONCAT71(criticalblock32.super_unique_lock._M_device._1_7_,
                        _height == initial_total_coins);
          criticalblock32.super_unique_lock._8_8_ = (element_type *)0x0;
          aStack_50._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
          criticalblock36.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1e215e9;
          criticalblock36.super_unique_lock._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
               + 0x7b;
          local_288._0_8_ = &height;
          result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
          result._0_8_ = &PTR__lazy_ostream_01388f48;
          result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
          result.val.field_2._M_allocated_capacity = (size_type)local_288;
          new_coins = (size_t)&initial_total_coins;
          local_220._8_8_ = local_220._9_8_ << 8;
          local_220._0_8_ = &PTR__lazy_ostream_01388f48;
          auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
          aaStack_208[0]._0_8_ = &new_coins;
          pvVar34 = (iterator)0x1;
          pvVar35 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&criticalblock32,(lazy_ostream *)&auto_infile,1,2,REQUIRE,
                     0xf563a2,(size_t)&criticalblock36,0x13f,&result,"initial_total_coins",local_220
                    );
          boost::detail::shared_count::~shared_count((shared_count *)&aStack_50);
          chains_tested = chains_tested + 1;
          _Var31._M_p = _Var31._M_p + 8;
          pCVar49 = pCVar27;
        } while (_Var31._M_p != pcVar50);
      }
      if (snapshot_path.super_path._M_pathname._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(snapshot_path.super_path._M_pathname._M_dataplus._M_p,
                        snapshot_path.super_path._M_pathname.field_2._M_allocated_capacity -
                        (long)snapshot_path.super_path._M_pathname._M_dataplus._M_p);
      }
      local_6f8[0] = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_6f8[1] = "";
      local_708[0] = &boost::unit_test::basic_cstring<char_const>::null;
      local_708[1] = &boost::unit_test::basic_cstring<char_const>::null;
      file_24.m_end = (iterator)0x143;
      file_24.m_begin = (iterator)local_6f8;
      msg_24.m_end = pvVar35;
      msg_24.m_begin = pvVar34;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)local_708,
                 msg_24);
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._1_8_ << 8);
      auto_infile.m_file = (FILE *)&PTR__lazy_ostream_01388f08;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0xf4aea1;
      new_coins = CONCAT44(new_coins._4_4_,2);
      criticalblock32.super_unique_lock._M_device =
           (mutex_type *)
           CONCAT71(criticalblock32.super_unique_lock._M_device._1_7_,chains_tested == 2);
      criticalblock32.super_unique_lock._8_8_ = (element_type *)0x0;
      aStack_50._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      snapshot_path.super_path._M_pathname._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      snapshot_path.super_path._M_pathname._M_string_length = (size_type)"";
      criticalblock36.super_unique_lock._M_device = (mutex_type *)&chains_tested;
      result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
      result._0_8_ = &PTR__lazy_ostream_013890c8;
      result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
      result.val.field_2._M_allocated_capacity = (size_type)&criticalblock36;
      local_288._0_8_ = &new_coins;
      local_220._8_8_ = local_220._9_8_ << 8;
      local_220._0_8_ = &PTR__lazy_ostream_013890c8;
      auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      aaStack_208[0]._0_8_ = local_288;
      pvVar34 = (iterator)0x1;
      pvVar35 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&criticalblock32,(lazy_ostream *)&auto_infile,1,2,REQUIRE,
                 0xf568c2,(size_t)&snapshot_path,0x143,&result,"2",local_220);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_50);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&total_coins);
      new_coins = 100;
      TestChain100Setup::mineBlocks(this_00,100);
      criticalblock36.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock36.super_unique_lock._8_8_ =
           criticalblock36.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock36.super_unique_lock);
      _height = 0;
      _chains_tested = 0;
      coins_missing_from_background = 0;
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&criticalblock32,pCVar27);
      uVar10 = criticalblock32.super_unique_lock._8_8_;
      if (criticalblock32.super_unique_lock._M_device ==
          (mutex_type *)criticalblock32.super_unique_lock._8_8_) {
        bVar11 = false;
      }
      else {
        sVar38 = 0;
        pmVar32 = criticalblock32.super_unique_lock._M_device;
        do {
          pCVar23 = (Chainstate *)(pmVar32->super___recursive_mutex_base)._M_mutex.__align;
          snapshot_path.super_path._M_pathname._M_dataplus._M_p =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          snapshot_path.super_path._M_pathname.field_2._M_allocated_capacity = 0x151;
          snapshot_path.super_path._M_pathname._M_string_length = (size_type)"";
          puVar24 = boost::unit_test::unit_test_log_t::operator<<
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,
                               (begin *)&snapshot_path);
          boost::unit_test::unit_test_log_t::operator()
                    ((unit_test_log_t *)&total_coins,(log_level)puVar24);
          local_220._8_8_ = local_220._9_8_ << 8;
          local_220._0_8_ = &PTR__lazy_ostream_0138e9f8;
          auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
          aaStack_208[0]._M_allocated_capacity = "Checking coins in ";
          Chainstate::ToString_abi_cxx11_((string *)&auto_infile,pCVar23);
          result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
          result._0_8_ = &PTR__lazy_ostream_0138e9b8;
          result.val._M_string_length = (size_type)local_220;
          result.val.field_2._M_allocated_capacity = (size_type)&auto_infile;
          boost::unit_test::ut_detail::entry_value_collector::operator<<
                    ((entry_value_collector *)&total_coins,(lazy_ostream *)&result);
          if (auto_infile.m_file !=
              (FILE *)&auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                       _M_impl.super__Vector_impl_data._M_finish) {
            operator_delete(auto_infile.m_file,
                            (ulong)(auto_infile.m_xor.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 1));
          }
          boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                    ((entry_value_collector *)&total_coins);
          pCVar18 = Chainstate::CoinsTip(pCVar23);
          pCVar25 = ChainstateManager::ActiveChainstate(pCVar27);
          psVar39 = (this_00->m_coinbase_txns).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar4 = (this_00->m_coinbase_txns).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pCVar27 = pCVar49;
          if (psVar39 != psVar4) {
            plVar28 = (long *)&chains_tested;
            if (pCVar23 == pCVar25) {
              plVar28 = (long *)&height;
            }
            do {
              peVar5 = (psVar39->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              result._0_8_ = *(undefined8 *)
                              (peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              result.val._0_16_ =
                   *(undefined1 (*) [16])
                    ((peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              result.val.field_2._M_allocated_capacity =
                   *(undefined8 *)
                    ((peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
              result.val.field_2._8_4_ = 0;
              iVar15 = (*(pCVar18->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                                 (pCVar18,&result);
              if ((char)iVar15 == '\0') {
                if (pCVar23 != pCVar25) {
                  sVar38 = sVar38 + 1;
                  coins_missing_from_background = sVar38;
                }
              }
              else {
                *plVar28 = *plVar28 + 1;
              }
              psVar39 = psVar39 + 1;
            } while (psVar39 != psVar4);
          }
          pmVar32 = (mutex_type *)((long)&(pmVar32->super___recursive_mutex_base)._M_mutex + 8);
          pCVar49 = pCVar27;
        } while (pmVar32 != (mutex_type *)uVar10);
        bVar11 = sVar38 == 100;
      }
      if (criticalblock32.super_unique_lock._M_device != (mutex_type *)0x0) {
        operator_delete(criticalblock32.super_unique_lock._M_device,
                        aStack_50._M_allocated_capacity -
                        (long)criticalblock32.super_unique_lock._M_device);
      }
      local_728 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_720 = "";
      local_738 = &boost::unit_test::basic_cstring<char_const>::null;
      local_730 = &boost::unit_test::basic_cstring<char_const>::null;
      file_25.m_end = (iterator)0x15f;
      file_25.m_begin = (iterator)&local_728;
      msg_25.m_end = pvVar35;
      msg_25.m_begin = pvVar34;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_738,
                 msg_25);
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._1_8_ << 8);
      auto_infile.m_file = (FILE *)&PTR__lazy_ostream_01388f08;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0xf4aea1;
      local_740 = initial_total_coins + 100;
      criticalblock32.super_unique_lock._M_device =
           (mutex_type *)
           CONCAT71(criticalblock32.super_unique_lock._M_device._1_7_,_height == local_740);
      criticalblock32.super_unique_lock._8_8_ = (element_type *)0x0;
      aStack_50._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      snapshot_path.super_path._M_pathname._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      snapshot_path.super_path._M_pathname._M_string_length =
           (long)
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
           + 0x7b;
      result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
      result._0_8_ = &PTR__lazy_ostream_01388f48;
      result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
      result.val.field_2._M_allocated_capacity = (size_type)&total_coins;
      local_220._8_8_ = local_220._9_8_ << 8;
      local_220._0_8_ = &PTR__lazy_ostream_01388f48;
      auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      aaStack_208[0]._0_8_ = local_288;
      pvVar34 = (iterator)0x1;
      pvVar35 = (iterator)0x2;
      total_coins = (size_t)&height;
      local_288._0_8_ = &local_740;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&criticalblock32,(lazy_ostream *)&auto_infile,1,2,REQUIRE,
                 0xf568d0,(size_t)&snapshot_path,0x15f,&result,"initial_total_coins + new_coins",
                 local_220);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_50);
      local_750 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_748 = "";
      local_760 = &boost::unit_test::basic_cstring<char_const>::null;
      local_758 = &boost::unit_test::basic_cstring<char_const>::null;
      file_26.m_end = (iterator)0x160;
      file_26.m_begin = (iterator)&local_750;
      msg_26.m_end = pvVar35;
      msg_26.m_begin = pvVar34;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_760,
                 msg_26);
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._1_8_ << 8);
      auto_infile.m_file = (FILE *)&PTR__lazy_ostream_01388f08;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
      criticalblock32.super_unique_lock._M_device =
           (mutex_type *)
           CONCAT71(criticalblock32.super_unique_lock._M_device._1_7_,
                    _chains_tested == initial_total_coins);
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0xf4aea1;
      criticalblock32.super_unique_lock._8_8_ = (element_type *)0x0;
      aStack_50._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      snapshot_path.super_path._M_pathname._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      snapshot_path.super_path._M_pathname._M_string_length =
           (long)
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
           + 0x7b;
      total_coins = (size_t)&chains_tested;
      result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
      result._0_8_ = &PTR__lazy_ostream_01388f48;
      result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
      result.val.field_2._M_allocated_capacity = (size_type)&total_coins;
      local_288._0_8_ = &initial_total_coins;
      local_220._8_8_ = local_220._9_8_ << 8;
      local_220._0_8_ = &PTR__lazy_ostream_01388f48;
      auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      aaStack_208[0]._0_8_ = local_288;
      pvVar34 = (iterator)0x1;
      pvVar35 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&criticalblock32,(lazy_ostream *)&auto_infile,1,2,REQUIRE,
                 0xf56900,(size_t)&snapshot_path,0x160,&result,"initial_total_coins",local_220);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_50);
      local_770 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_768 = "";
      local_780 = &boost::unit_test::basic_cstring<char_const>::null;
      local_778 = &boost::unit_test::basic_cstring<char_const>::null;
      file_27.m_end = (iterator)0x161;
      file_27.m_begin = (iterator)&local_770;
      msg_27.m_end = pvVar35;
      msg_27.m_begin = pvVar34;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_780,
                 msg_27);
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._1_8_ << 8);
      auto_infile.m_file = (FILE *)&PTR__lazy_ostream_01388f08;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0xf4aea1;
      criticalblock32.super_unique_lock._M_device =
           (mutex_type *)CONCAT71(criticalblock32.super_unique_lock._M_device._1_7_,bVar11);
      criticalblock32.super_unique_lock._8_8_ = (element_type *)0x0;
      aStack_50._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      snapshot_path.super_path._M_pathname._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      snapshot_path.super_path._M_pathname._M_string_length =
           (long)
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
           + 0x7b;
      total_coins = (size_t)&coins_missing_from_background;
      result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
      result._0_8_ = &PTR__lazy_ostream_01388f48;
      result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
      result.val.field_2._M_allocated_capacity = (size_type)&total_coins;
      local_288._0_8_ = &new_coins;
      local_220._8_8_ = local_220._9_8_ << 8;
      local_220._0_8_ = &PTR__lazy_ostream_01388f48;
      auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      aaStack_208[0]._0_8_ = local_288;
      pvVar34 = (iterator)0x1;
      pvVar35 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&criticalblock32,(lazy_ostream *)&auto_infile,1,2,REQUIRE,
                 0xf56914,(size_t)&snapshot_path,0x161,&result,"new_coins",local_220);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_50);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock36.super_unique_lock);
      local_790 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_788 = "";
      local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_798 = &boost::unit_test::basic_cstring<char_const>::null;
      file_28.m_end = (iterator)0x165;
      file_28.m_begin = (iterator)&local_790;
      msg_28.m_end = pvVar35;
      msg_28.m_begin = pvVar34;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_7a0,
                 msg_28);
      _cVar51 = 0x772c84;
      bVar11 = CreateAndActivateUTXOSnapshot<__25_const>(this_00);
      local_220[0] = !bVar11;
      local_220._8_8_ = (element_type *)0x0;
      auStack_210 = (undefined1  [8])0x0;
      auto_infile.m_file = (FILE *)anon_var_dwarf_1e2f0cb;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xf563df;
      result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
      result._0_8_ = &PTR__lazy_ostream_01389048;
      result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
      local_7b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_7a8 = "";
      pvVar34 = (iterator)0x2;
      pvVar35 = (iterator)0x0;
      result.val.field_2._M_allocated_capacity = (size_type)&auto_infile;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_220,(lazy_ostream *)&result,2,0,WARN,_cVar51,
                 (size_t)&local_7b0,0x165);
      boost::detail::shared_count::~shared_count((shared_count *)auStack_210);
      local_7c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_7b8 = "";
      local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_29.m_end = (iterator)0x16a;
      file_29.m_begin = (iterator)&local_7c0;
      msg_29.m_end = pvVar35;
      msg_29.m_begin = pvVar34;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_7d0,
                 msg_29);
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._1_8_ << 8);
      auto_infile.m_file = (FILE *)&PTR__lazy_ostream_01388f08;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0xf4aea1;
      pCVar23 = ChainstateManager::ActiveChainstate(pCVar49);
      auVar44[0] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[0x10] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar44[1] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[0x11] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar44[2] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[0x12] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar44[3] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[0x13] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar44[4] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[0x14] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar44[5] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[0x15] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar44[6] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[0x16] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar44[7] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[0x17] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar44[8] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[0x18] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar44[9] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[0x19] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar44[10] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>
                      ._M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0x1a] ==
                     loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar44[0xb] = -((pCVar23->m_from_snapshot_blockhash).
                       super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar44[0xc] = -((pCVar23->m_from_snapshot_blockhash).
                       super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar44[0xd] = -((pCVar23->m_from_snapshot_blockhash).
                       super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar44[0xe] = -((pCVar23->m_from_snapshot_blockhash).
                       super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar44[0xf] = -((pCVar23->m_from_snapshot_blockhash).
                       super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar42[0] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[0] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0]);
      auVar42[1] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[1] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[1]);
      auVar42[2] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[2] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[2]);
      auVar42[3] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[3] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[3]);
      auVar42[4] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[4] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[4]);
      auVar42[5] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[5] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[5]);
      auVar42[6] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[6] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[6]);
      auVar42[7] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[7] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[7]);
      auVar42[8] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[8] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8]);
      auVar42[9] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                     super_base_blob<256U>.m_data._M_elems[9] ==
                    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9]);
      auVar42[10] = -((pCVar23->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>
                      ._M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[10] ==
                     loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10]);
      auVar42[0xb] = -((pCVar23->m_from_snapshot_blockhash).
                       super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0xb] ==
                      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar42[0xc] = -((pCVar23->m_from_snapshot_blockhash).
                       super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0xc] ==
                      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar42[0xd] = -((pCVar23->m_from_snapshot_blockhash).
                       super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0xd] ==
                      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar42[0xe] = -((pCVar23->m_from_snapshot_blockhash).
                       super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0xe] ==
                      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar42[0xf] = -((pCVar23->m_from_snapshot_blockhash).
                       super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0xf] ==
                      loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf]);
      criticalblock36.super_unique_lock._M_device =
           (mutex_type *)&pCVar23->m_from_snapshot_blockhash;
      auVar42 = auVar42 & auVar44;
      criticalblock32.super_unique_lock._M_device =
           (mutex_type *)
           CONCAT71(criticalblock32.super_unique_lock._M_device._1_7_,
                    (ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) == 0xffff);
      criticalblock32.super_unique_lock._8_8_ = (element_type *)0x0;
      aStack_50._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      snapshot_path.super_path._M_pathname._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      snapshot_path.super_path._M_pathname._M_string_length = (size_type)"";
      result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
      result._0_8_ = &PTR__lazy_ostream_01389a00;
      result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
      result.val.field_2._M_allocated_capacity = (size_type)&criticalblock36;
      total_coins = (size_t)&loaded_snapshot_blockhash;
      local_220._8_8_ = local_220._9_8_ << 8;
      local_220._0_8_ = &PTR__lazy_ostream_01389a00;
      auStack_210 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      aaStack_208[0]._0_8_ = &total_coins;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&criticalblock32,(lazy_ostream *)&auto_infile,1,2,REQUIRE,
                 0xf567d8,(size_t)&snapshot_path,0x16a,&result,"loaded_snapshot_blockhash",
                 (assertion_result *)local_220);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_50);
      *(Chainstate **)
       &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
        super_BasicTestingSetup.m_interrupt = pCVar19;
      *(Chainstate **)
       &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
        super_BasicTestingSetup.m_interrupt.m_pipe_w = pCVar17;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        tVar47.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.
        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
        tVar47.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.
        super__Tuple_impl<1UL,_Chainstate_*>.super__Head_base<1UL,_Chainstate_*,_false>._M_head_impl
             = (_Head_base<1UL,_Chainstate_*,_false>)(_Head_base<1UL,_Chainstate_*,_false>)this;
        return (tuple<Chainstate_*,_Chainstate_*>)
               tVar47.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>;
      }
      __stack_chk_fail();
    }
    if (pAVar29->height == 0x6e) {
      pCVar30 = &op;
      for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
        *(undefined8 *)(pCVar30->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems =
             *(undefined8 *)pAVar29;
        pAVar29 = (pointer)((long)pAVar29 + (ulong)bVar40 * -0x10 + 8);
        pCVar30 = (COutPoint *)((long)pCVar30 + (ulong)bVar40 * -0x10 + 8);
      }
      uVar13 = 1;
      goto LAB_00771a17;
    }
    pAVar29 = pAVar29 + 1;
  } while( true );
}

Assistant:

std::tuple<Chainstate*, Chainstate*> SetupSnapshot()
    {
        ChainstateManager& chainman = *Assert(m_node.chainman);

        BOOST_CHECK(!chainman.IsSnapshotActive());

        {
            LOCK(::cs_main);
            BOOST_CHECK(!chainman.IsSnapshotValidated());
            BOOST_CHECK(!node::FindSnapshotChainstateDir(chainman.m_options.datadir));
        }

        size_t initial_size;
        size_t initial_total_coins{100};

        // Make some initial assertions about the contents of the chainstate.
        {
            LOCK(::cs_main);
            CCoinsViewCache& ibd_coinscache = chainman.ActiveChainstate().CoinsTip();
            initial_size = ibd_coinscache.GetCacheSize();
            size_t total_coins{0};

            for (CTransactionRef& txn : m_coinbase_txns) {
                COutPoint op{txn->GetHash(), 0};
                BOOST_CHECK(ibd_coinscache.HaveCoin(op));
                total_coins++;
            }

            BOOST_CHECK_EQUAL(total_coins, initial_total_coins);
            BOOST_CHECK_EQUAL(initial_size, initial_total_coins);
        }

        Chainstate& validation_chainstate = chainman.ActiveChainstate();

        // Snapshot should refuse to load at this height.
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(this));
        BOOST_CHECK(!chainman.ActiveChainstate().m_from_snapshot_blockhash);
        BOOST_CHECK(!chainman.SnapshotBlockhash());

        // Mine 10 more blocks, putting at us height 110 where a valid assumeutxo value can
        // be found.
        constexpr int snapshot_height = 110;
        mineBlocks(10);
        initial_size += 10;
        initial_total_coins += 10;

        // Should not load malleated snapshots
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // A UTXO is missing but count is correct
                metadata.m_coins_count -= 1;

                Txid txid;
                auto_infile >> txid;
                // coins size
                (void)ReadCompactSize(auto_infile);
                // vout index
                (void)ReadCompactSize(auto_infile);
                Coin coin;
                auto_infile >> coin;
        }));

        BOOST_CHECK(!node::FindSnapshotChainstateDir(chainman.m_options.datadir));

        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Coins count is larger than coins in file
                metadata.m_coins_count += 1;
        }));
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Coins count is smaller than coins in file
                metadata.m_coins_count -= 1;
        }));
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Wrong hash
                metadata.m_base_blockhash = uint256::ZERO;
        }));
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Wrong hash
                metadata.m_base_blockhash = uint256::ONE;
        }));

        BOOST_REQUIRE(CreateAndActivateUTXOSnapshot(this));
        BOOST_CHECK(fs::exists(*node::FindSnapshotChainstateDir(chainman.m_options.datadir)));

        // Ensure our active chain is the snapshot chainstate.
        BOOST_CHECK(!chainman.ActiveChainstate().m_from_snapshot_blockhash->IsNull());
        BOOST_CHECK_EQUAL(
            *chainman.ActiveChainstate().m_from_snapshot_blockhash,
            *chainman.SnapshotBlockhash());

        Chainstate& snapshot_chainstate = chainman.ActiveChainstate();

        {
            LOCK(::cs_main);

            fs::path found = *node::FindSnapshotChainstateDir(chainman.m_options.datadir);

            // Note: WriteSnapshotBaseBlockhash() is implicitly tested above.
            BOOST_CHECK_EQUAL(
                *node::ReadSnapshotBaseBlockhash(found),
                *chainman.SnapshotBlockhash());
        }

        const auto& au_data = ::Params().AssumeutxoForHeight(snapshot_height);
        const CBlockIndex* tip = WITH_LOCK(chainman.GetMutex(), return chainman.ActiveTip());

        BOOST_CHECK_EQUAL(tip->m_chain_tx_count, au_data->m_chain_tx_count);

        // To be checked against later when we try loading a subsequent snapshot.
        uint256 loaded_snapshot_blockhash{*chainman.SnapshotBlockhash()};

        // Make some assertions about the both chainstates. These checks ensure the
        // legacy chainstate hasn't changed and that the newly created chainstate
        // reflects the expected content.
        {
            LOCK(::cs_main);
            int chains_tested{0};

            for (Chainstate* chainstate : chainman.GetAll()) {
                BOOST_TEST_MESSAGE("Checking coins in " << chainstate->ToString());
                CCoinsViewCache& coinscache = chainstate->CoinsTip();

                // Both caches will be empty initially.
                BOOST_CHECK_EQUAL((unsigned int)0, coinscache.GetCacheSize());

                size_t total_coins{0};

                for (CTransactionRef& txn : m_coinbase_txns) {
                    COutPoint op{txn->GetHash(), 0};
                    BOOST_CHECK(coinscache.HaveCoin(op));
                    total_coins++;
                }

                BOOST_CHECK_EQUAL(initial_size , coinscache.GetCacheSize());
                BOOST_CHECK_EQUAL(total_coins, initial_total_coins);
                chains_tested++;
            }

            BOOST_CHECK_EQUAL(chains_tested, 2);
        }

        // Mine some new blocks on top of the activated snapshot chainstate.
        constexpr size_t new_coins{100};
        mineBlocks(new_coins);  // Defined in TestChain100Setup.

        {
            LOCK(::cs_main);
            size_t coins_in_active{0};
            size_t coins_in_background{0};
            size_t coins_missing_from_background{0};

            for (Chainstate* chainstate : chainman.GetAll()) {
                BOOST_TEST_MESSAGE("Checking coins in " << chainstate->ToString());
                CCoinsViewCache& coinscache = chainstate->CoinsTip();
                bool is_background = chainstate != &chainman.ActiveChainstate();

                for (CTransactionRef& txn : m_coinbase_txns) {
                    COutPoint op{txn->GetHash(), 0};
                    if (coinscache.HaveCoin(op)) {
                        (is_background ? coins_in_background : coins_in_active)++;
                    } else if (is_background) {
                        coins_missing_from_background++;
                    }
                }
            }

            BOOST_CHECK_EQUAL(coins_in_active, initial_total_coins + new_coins);
            BOOST_CHECK_EQUAL(coins_in_background, initial_total_coins);
            BOOST_CHECK_EQUAL(coins_missing_from_background, new_coins);
        }

        // Snapshot should refuse to load after one has already loaded.
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(this));

        // Snapshot blockhash should be unchanged.
        BOOST_CHECK_EQUAL(
            *chainman.ActiveChainstate().m_from_snapshot_blockhash,
            loaded_snapshot_blockhash);
        return std::make_tuple(&validation_chainstate, &snapshot_chainstate);
    }